

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLutmin.c
# Opt level: O0

Abc_Obj_t *
Abc_NtkCreateCofLut(Abc_Ntk_t *pNtkNew,DdManager *dd,DdNode *bCof,Abc_Obj_t *pNode,int Level)

{
  int iVar1;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pAVar2;
  DdNode *n;
  DdNode *pDVar3;
  int local_44;
  int i;
  Abc_Obj_t *pNodeNew;
  DdNode *bFuncNew;
  int fVerbose;
  int Level_local;
  Abc_Obj_t *pNode_local;
  DdNode *bCof_local;
  DdManager *dd_local;
  Abc_Ntk_t *pNtkNew_local;
  
  iVar1 = Abc_ObjFaninNum(pNode);
  if (iVar1 <= Level) {
    __assert_fail("Abc_ObjFaninNum(pNode) > Level",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcLutmin.c"
                  ,0x17e,
                  "Abc_Obj_t *Abc_NtkCreateCofLut(Abc_Ntk_t *, DdManager *, DdNode *, Abc_Obj_t *, int)"
                 );
  }
  pObj = Abc_NtkCreateNode(pNtkNew);
  for (local_44 = Level; iVar1 = Abc_ObjFaninNum(pNode), local_44 < iVar1; local_44 = local_44 + 1)
  {
    pAVar2 = Abc_ObjFanin(pNode,local_44);
    Abc_ObjAddFanin(pObj,(pAVar2->field_6).pCopy);
  }
  n = Extra_bddMove(dd,bCof,-Level);
  Cudd_Ref(n);
  pDVar3 = Extra_TransferLevelByLevel(dd,(DdManager *)pNtkNew->pManFunc,n);
  (pObj->field_5).pData = pDVar3;
  Cudd_Ref((DdNode *)(pObj->field_5).pData);
  Cudd_RecursiveDeref(dd,n);
  return pObj;
}

Assistant:

Abc_Obj_t * Abc_NtkCreateCofLut( Abc_Ntk_t * pNtkNew, DdManager * dd, DdNode * bCof, Abc_Obj_t * pNode, int Level )
{
    int fVerbose = 0;
    DdNode * bFuncNew;
    Abc_Obj_t * pNodeNew;
    int i;
    assert( Abc_ObjFaninNum(pNode) > Level );
    // create a new node
    pNodeNew = Abc_NtkCreateNode( pNtkNew );
    // add the fanins in the order, in which they appear in the reordered manager
    for ( i = Level; i < Abc_ObjFaninNum(pNode); i++ )
        Abc_ObjAddFanin( pNodeNew, Abc_ObjFanin(pNode, i)->pCopy );
if ( fVerbose )
{
Extra_bddPrint( dd, bCof );
printf( "\n" );
printf( "\n" );
}
    // transfer the function
    bFuncNew = Extra_bddMove( dd, bCof, -Level );  Cudd_Ref( bFuncNew );
if ( fVerbose )
{
Extra_bddPrint( dd, bFuncNew );
printf( "\n" );
printf( "\n" );
}
    pNodeNew->pData = Extra_TransferLevelByLevel( dd, (DdManager *)pNtkNew->pManFunc, bFuncNew );  Cudd_Ref( (DdNode *)pNodeNew->pData );
//Extra_bddPrint( pNtkNew->pManFunc, pNodeNew->pData );
//printf( "\n" );
//printf( "\n" );
    Cudd_RecursiveDeref( dd, bFuncNew );
    return pNodeNew;
}